

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O2

void __thiscall
QRhiResourceUpdateBatchPrivate::free(QRhiResourceUpdateBatchPrivate *this,void *__ptr)

{
  quint64 *pqVar1;
  long lVar2;
  byte bVar3;
  BufferOp *op;
  void *pvVar4;
  QDebug *pQVar5;
  long lVar6;
  int iVar7;
  uint t;
  uint t_00;
  long in_FS_OFFSET;
  QDebug local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar4 = (this->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.
           super_QVLABaseBase.ptr;
  t = 0;
  t_00 = 0;
  for (lVar6 = (this->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.
               super_QVLABaseBase.s * 0x30; lVar6 != 0; lVar6 = lVar6 + -0x30) {
    lVar2 = *(long *)((long)pvVar4 + 0x18);
    if (lVar2 == 0) {
      iVar7 = 0;
    }
    else {
      t_00 = t_00 + *(int *)(lVar2 + 4);
      iVar7 = *(int *)(lVar2 + 0x18);
    }
    t = t + iVar7;
    pvVar4 = (void *)((long)pvVar4 + 0x30);
  }
  QtPrivateLogging::QRHI_LOG_RUB();
  if (((byte)QtPrivateLogging::QRHI_LOG_RUB::category.field_2.bools.enabledDebug._q_value._M_base.
             _M_i & 1) != 0) {
    QMessageLogger::debug();
    pQVar5 = QDebug::operator<<(&local_38,"[rub] release to pool upd.batch #");
    pQVar5 = QDebug::operator<<(pQVar5,this->poolIndex);
    pQVar5 = QDebug::operator<<(pQVar5,"/ bufferOps active");
    pQVar5 = QDebug::operator<<(pQVar5,this->activeBufferOpCount);
    pQVar5 = QDebug::operator<<(pQVar5,"of");
    pQVar5 = QDebug::operator<<(pQVar5,(this->bufferOps).
                                       super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.
                                       super_QVLABaseBase.s);
    pQVar5 = QDebug::operator<<(pQVar5,"data");
    pQVar5 = QDebug::operator<<(pQVar5,t_00);
    pQVar5 = QDebug::operator<<(pQVar5,"largeAlloc");
    pQVar5 = QDebug::operator<<(pQVar5,t);
    pQVar5 = QDebug::operator<<(pQVar5,"textureOps active");
    pQVar5 = QDebug::operator<<(pQVar5,this->activeTextureOpCount);
    pQVar5 = QDebug::operator<<(pQVar5,"of");
    QDebug::operator<<(pQVar5,(this->textureOps).
                              super_QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp>.
                              super_QVLABaseBase.s);
    QDebug::~QDebug(&local_38);
  }
  this->activeBufferOpCount = 0;
  this->activeTextureOpCount = 0;
  bVar3 = (byte)this->poolIndex & 0x3f;
  pqVar1 = &this->rhi->resUpdPoolMap;
  *pqVar1 = *pqVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
  this->poolIndex = -1;
  QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp>::clear
            (&(this->textureOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp>);
  if (0x100000 < t) {
    QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>::clear
              (&(this->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiResourceUpdateBatchPrivate::free()
{
    Q_ASSERT(poolIndex >= 0 && rhi->resUpdPool[poolIndex] == q);

    quint32 bufferDataTotal = 0;
    quint32 bufferLargeAllocTotal = 0;
    for (const BufferOp &op : std::as_const(bufferOps)) {
        bufferDataTotal += op.data.size();
        bufferLargeAllocTotal += op.data.largeAlloc(); // alloc when > 1 KB
    }

    if (QRHI_LOG_RUB().isDebugEnabled()) {
        qDebug() << "[rub] release to pool upd.batch #" << poolIndex
                << "/ bufferOps active" << activeBufferOpCount
                << "of" << bufferOps.count()
                << "data" << bufferDataTotal
                << "largeAlloc" << bufferLargeAllocTotal
                << "textureOps active" << activeTextureOpCount
                << "of" << textureOps.count();
    }

    activeBufferOpCount = 0;
    activeTextureOpCount = 0;

    const quint64 mask = 1ULL << quint64(poolIndex);
    rhi->resUpdPoolMap &= ~mask;
    poolIndex = -1;

    // textureOps is cleared, to not keep the potentially large image pixel
    // data alive, but it is expected that the container keeps the list alloc
    // at least. Only trimOpList() goes for the more aggressive route with squeeze.
    textureOps.clear();

    // bufferOps is not touched in many cases, to allow reusing allocations
    // (incl. in the elements' QRhiBufferData) as much as possible when this
    // batch is used again in the future, which is important for performance, in
    // particular with Qt Quick where it is easy for scenes to produce lots of,
    // typically small buffer changes on every frame.
    //
    // However, ensure that even in the unlikely case of having the max number
    // of batches (64) created in resUpdPool, no more than 64 MB in total is
    // used up by buffer data just to help future reuse. For simplicity, if
    // there is more than 1 MB data -> clear. Applications with frequent, huge
    // buffer updates probably have other bottlenecks anyway.
    if (bufferLargeAllocTotal > 1024 * 1024)
        bufferOps.clear();
}